

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O3

int VHTightenHull(ImVec2 *hull,int n,double threshold)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = (ulong)(uint)n;
  if (0 < n) {
    uVar10 = 1;
    do {
      uVar8 = 0;
      if (uVar10 != uVar1) {
        uVar8 = uVar10;
      }
      dVar12 = atan2((double)(hull[uVar8].y - hull[uVar10 - 1].y),
                     (double)(hull[uVar8].x - hull[uVar10 - 1].x));
      dVar13 = atan2((double)(hull[(ulong)((int)uVar10 + 1) % uVar1].y - hull[uVar8].y),
                     (double)(hull[(ulong)((int)uVar10 + 1) % uVar1].x - hull[uVar8].x));
      if ((double)(~-(ulong)(dVar13 < dVar12) & (ulong)(dVar13 - dVar12) |
                  (ulong)(dVar12 - dVar13) & -(ulong)(dVar13 < dVar12)) < threshold) {
        hull[uVar8] = hull[uVar10 - 1];
      }
      bVar11 = uVar10 != uVar1;
      uVar10 = uVar10 + 1;
    } while (bVar11);
  }
  lVar5 = 0;
  iVar9 = 0;
  do {
    lVar3 = (long)iVar9;
    iVar6 = n;
    if (n < iVar9) {
      iVar6 = iVar9;
    }
    lVar2 = 0;
    while( true ) {
      lVar4 = lVar2;
      if (iVar6 - lVar3 == lVar4) {
        return (int)lVar5;
      }
      iVar7 = ((int)lVar4 + iVar9 + 1) % n;
      if ((hull[lVar3 + lVar4].x != hull[iVar7].x) ||
         (NAN(hull[lVar3 + lVar4].x) || NAN(hull[iVar7].x))) break;
      if ((hull[lVar3 + lVar4].y != hull[iVar7].y) ||
         (lVar2 = lVar4 + 1, NAN(hull[lVar3 + lVar4].y) || NAN(hull[iVar7].y))) break;
    }
    hull[lVar5] = hull[lVar3 + lVar4];
    lVar5 = lVar5 + 1;
    iVar9 = iVar9 + (int)lVar4 + 1;
  } while( true );
}

Assistant:

int VHTightenHull(ImVec2 hull[], int n, double threshold) {
	// theory: circle the hull, compare 3 points at a time, if the mid point is
	// sub-angular then make it equal the first point and move to the 3rd.
	int i, ni;
	ImVec2 *a, *b, *c;
	double a1, a2, ad;
	// First cycle, we look for sub-threshold 2-segment runs
	for (i = 0; i < n; i++) {
		a = &(hull[i]);
		b = &(hull[(i + 1) % n]);
		c = &(hull[(i + 2) % n]);

		a1 = VHAngleToX(*a, *b);
		a2 = VHAngleToX(*b, *c);
		if (a1 > a2)
			ad = a1 - a2;
		else
			ad = a2 - a1;

		if (ad < threshold) {
			//			fprintf(stderr,"angle below threshold
			//(%0.2f)\n", ad);
			*b = *a;
		}
	} // end first cycle

	// Second cycle, we compact the hull
	int output_index = 0;
	i                = 0;
	while (i < n) {
		ni = (i + 1) % n;
		if ((hull[i].x == hull[ni].x) && (hull[i].y == hull[ni].y)) {
			// match found, discard one
			i++;
			continue;
		}

		hull[output_index] = hull[i];
		output_index++;
		i++;
	}

	return output_index;
}